

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void buglist_end_fun(CHAR_DATA *ch,char *argument)

{
  char *pcVar1;
  char *pcVar2;
  char query [4608];
  char acStack_1228 [4616];
  
  pcVar1 = ch->true_name;
  pcVar2 = log_time();
  sprintf(acStack_1228,"INSERT INTO buglist VALUES(nullptr, \'%s\', \'%s\', \'%s\', \'%s\', 0)",
          pcVar1,pcVar2,ch->pcdata->temp_str,argument);
  one_query(acStack_1228);
  free_pstring(ch->pcdata->temp_str);
  send_to_char("Bug has been reported.\n\r",ch);
  return;
}

Assistant:

void buglist_end_fun(CHAR_DATA *ch, char *argument)
{
	char query[MSL];

	sprintf(query, "INSERT INTO buglist VALUES(nullptr, '%s', '%s', '%s', '%s', 0)",
		ch->true_name,
		log_time(),
		ch->pcdata->temp_str,
		argument);
	one_query(query);

	free_pstring(ch->pcdata->temp_str);
	send_to_char("Bug has been reported.\n\r", ch);
}